

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O3

int Doolittle8(uchar *mat,int *pivot,int n)

{
  ulong uVar1;
  byte bVar2;
  char cVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int i;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  uchar *puVar23;
  bool bVar24;
  
  uVar5 = n - 1;
  if (1 < n) {
    uVar13 = (ulong)((uint)n >> 3);
    uVar21 = 1;
    uVar14 = 0;
    uVar19 = uVar13;
    puVar23 = mat;
    do {
      uVar17 = (uint)uVar14;
      pivot[uVar14] = uVar17;
      uVar1 = uVar14 + 1;
      uVar16 = uVar14 >> 3 & 0x1fffffff;
      uVar7 = ~uVar17 & 7;
      lVar10 = uVar14 * uVar13;
      uVar12 = uVar14 & 0xffffffff;
      uVar18 = uVar19;
      uVar22 = uVar21;
      do {
        uVar15 = (uint)uVar12;
        bVar24 = ((~(uint)mat[uVar16 + lVar10] &
                  (uint)mat[((uint)n >> 3) * (uint)uVar22 + (int)uVar16]) >> uVar7 & 1) != 0;
        if (7 < (uint)n) {
          uVar12 = 0;
          do {
            uVar15 = (int)uVar12 + (int)uVar18;
            bVar4 = mat[uVar15];
            bVar2 = (byte)-(uint)bVar24;
            mat[uVar15] = puVar23[uVar12] & bVar2 | bVar24 - 1U & bVar4;
            puVar23[uVar12] = bVar4 & bVar2 | puVar23[uVar12] & bVar24 - 1U;
            uVar12 = uVar12 + 1;
          } while (uVar13 != uVar12);
          uVar15 = pivot[uVar14];
        }
        if (bVar24) {
          uVar15 = 0;
        }
        uVar15 = uVar15 | -(uint)bVar24 & (uint)uVar22;
        uVar12 = (ulong)uVar15;
        pivot[uVar14] = uVar15;
        uVar22 = uVar22 + 1;
        uVar18 = uVar18 + uVar13;
      } while (uVar22 != (uint)n);
      if ((mat[(uVar17 * n >> 3) + uVar16] >> uVar7 & 1) == 0) {
        return -1;
      }
      uVar15 = (uint)uVar1 & 7;
      uVar20 = (uint)uVar1 >> 3;
      cVar3 = (char)(0x100 >> (sbyte)uVar15);
      uVar14 = uVar21;
      do {
        lVar8 = uVar14 * uVar13;
        uVar9 = (uint)mat[((uint)((int)uVar14 * n) >> 3) + uVar16] & 1 << (sbyte)uVar7;
        bVar4 = mat[lVar10 + (ulong)uVar20];
        if (uVar9 == 0) {
          bVar4 = (byte)uVar9;
        }
        mat[lVar8 + (ulong)uVar20] =
             (bVar4 ^ mat[lVar8 + (ulong)uVar20]) & cVar3 - 1U | mat[lVar8 + (ulong)uVar20] & -cVar3
        ;
        for (iVar11 = (uVar17 - uVar15) + 9; iVar11 < n; iVar11 = iVar11 + 8) {
          iVar6 = iVar11 + 7;
          if (-1 < iVar11) {
            iVar6 = iVar11;
          }
          bVar4 = mat[(iVar6 >> 3) + (int)lVar10];
          if (uVar9 == 0) {
            bVar4 = (byte)uVar9;
          }
          mat[(iVar6 >> 3) + (int)lVar8] = mat[(iVar6 >> 3) + (int)lVar8] ^ bVar4;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != (uint)n);
      uVar21 = uVar21 + 1;
      puVar23 = puVar23 + uVar13;
      uVar19 = uVar19 + uVar13;
      uVar14 = uVar1;
    } while (uVar1 != uVar5);
  }
  pivot[(int)uVar5] = uVar5;
  iVar11 = n + 7;
  if (-1 < n) {
    iVar11 = n;
  }
  return (mat[(long)((iVar11 >> 3) * n) + -1] & 1) - 1;
}

Assistant:

int Doolittle8(unsigned char *mat, int *pivot, int n)
{

  /* LU pseudo code (inplace, without pivoting)
      // n-1 Iterationsschritte
      for k := 1 to n-1
       // Zeilen der Restmatrix werden durchlaufen
       for i := k+1 to n
         // Berechnung von L
         A(i,k) := A(i,k) / A(k,k) // Achtung: vorher Prüfung auf Nullwerte notwendig
         // Spalten der Restmatrix werden durchlaufen
         for j := k+1 to n
           // Berechnung von R
           A(i,j) := A(i,j) - A(i,k) * A(k,j)
   */

  for(int k = 0; k < n-1; k++)
  {

    /*
     * swap rows in constant time ...
     */

    pivot[k] = k;

    unsigned char tmp;
    for(unsigned int j = k+1; j < n; j++)
    {
      unsigned int mask_cpy = (mat[(n/8)*j + k/8] >> (7 - (k % 8))) & 1; // note: type has to be large enough to use as mask with j in pivot computing
      mask_cpy = mask_cpy & !((mat[(n/8)*k + k/8] >> (7 - (k % 8))) & 1);  // add this in order to only actually switch with the first suitable row => consistent with "ref" non-constant-time impl
      mask_cpy = -mask_cpy;
      for(int c = 0; c < n/8; c++)
      {
        tmp = mat[(n/8)*j + c];
        mat[(n/8)*j + c] = (mat[(n/8)*j + c] & ~mask_cpy) | (mat[(n/8)*k + c] & mask_cpy);
        mat[(n/8)*k + c] = (mat[(n/8)*k + c] & ~mask_cpy) | (tmp & mask_cpy);
      }

      // update pivot
      pivot[k] = (j & mask_cpy) | (pivot[k] & ~mask_cpy);
    }

    if (!((mat[k*n/8 + (k/8)] >> (7 - (k % 8))) & 1))
    {
      return -1;
    }

    // for i := k+1 to n
    //      for j := k+1 to n
    //          A(i,j) := A(i,j) - A(i,k) * A(k,j)
    //
    // Bitwise: A(i,j) := A(i,j) ^ A(i,k) & A(k,j)
    // idea: take element A(i,k). It's either 0 or 1. Expand to 8 bits. Multiply with A(k,j), ... A(k,j+7)
    // basically, bit A(i,k) decides whether row A(k) (starting from the k+1'th column) is added to the i+1'th, ..., n'th rows below
    // use a mask for constant time instead of if(bit==1)


    for(int i = k+1; i < n; i++)
    {
      // 0x00 iff A(i,k) is zero. Otherweise 0xFF
      unsigned char mask_ik = 0x00 - ((mat[i*n/8 + (k/8)] >> (7 - (k % 8))) & 1);

      /*
       * First, handle the case that j = k+1 is not divisible by 8; i.e. only handle the last j%8 bits of this byte
       */
      unsigned char mask_prepending = (unsigned char) (0x100 >> ((k+1) % 8)) - 1;

      unsigned char tmp = mat[n/8*i + (k+1)/8] & ~mask_prepending; // store the left side of the splitted byte in tmp
      mat[i*(n/8) + (k+1)/8]  ^= (mask_ik & mat[k*(n/8) + (k+1)/8]);

      // restore the left bits: first set bits 0, then 'or' tmp
      mat[n/8*i + (k+1)/8] &= mask_prepending;
      mat[n/8*i + (k+1)/8] |= tmp;


      /*
       * now handle the rest of the row efficiently in byte-aligned byte-chunks
       */
      for(int j = k+1 + (8-((k+1)%8)); j < n; j += 8)
      {
        // A(i,j) = A(i,j) + mask_ik * A(k,j)
        // => XOR Bits A(i,j) ... A(i,j+7) with (mask_ik & (A(k,j), ... A(k,j+7))
        mat[i*(n/8) + j/8] ^= mask_ik & mat[k*(n/8) + j/8];
      }
    }
  }
  pivot[n-1] = n-1;

  if ((mat[(n/8)*(n-1) + n/8-1] & 0x01) == 0)
  {
    return -1;
  }
  return 0;
}